

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void opengv::relative_pose::modules::fivept_nister_main
               (Matrix<double,_9,_4,_0,_9,_4> *EE,essentials_t *essentials)

{
  PlainObjectBase<Eigen::Matrix<double,10,10,0,10,10>> *A_00;
  undefined1 auVar1 [16];
  PointerType pdVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  double *pdVar6;
  double *pdVar7;
  size_t i;
  Matrix<double,_1,_11,_1,_1,_11> *pMVar8;
  ulong uVar9;
  size_t c;
  PointerType pdVar10;
  bool bVar11;
  double dVar12;
  double dVar13;
  undefined1 auVar14 [64];
  MatrixXd Evec;
  vector<double,_std::allocator<double>_> roots;
  double z;
  MatrixXd norms;
  MatrixXd EvecNorms;
  Matrix<double,_1,_11,_1,_1,_11> p_order10_part1;
  Sturm sturmSequence;
  Matrix<double,_1,_4,_1,_1,_4> b22;
  Matrix<double,_1,_4,_1,_1,_4> b12;
  essential_t essential;
  Matrix<double,_1,_5,_1,_1,_5> b23;
  Matrix<double,_1,_4,_1,_1,_4> b32;
  Matrix<double,_1,_4,_1,_1,_4> b32_part1;
  Matrix<double,_1,_4,_1,_1,_4> b22_part1;
  Matrix<double,_1,_4,_1,_1,_4> b12_part1;
  Matrix<double,_1,_4,_1,_1,_4> b31;
  Matrix<double,_1,_4,_1,_1,_4> b31_part1;
  Matrix<double,_1,_4,_1,_1,_4> b21;
  Matrix<double,_1,_4,_1,_1,_4> b21_part1;
  Matrix<double,_1,_4,_1,_1,_4> b11;
  Matrix<double,_1,_4,_1,_1,_4> b11_part1;
  Matrix<double,_1,_7,_1,_1,_7> p3;
  Matrix<double,_1,_5,_1,_1,_5> b33;
  Matrix<double,_1,_5,_1,_1,_5> b23_part1;
  Matrix<double,_1,_5,_1,_1,_5> b13;
  Matrix<double,_1,_5,_1,_1,_5> b13_part1;
  Matrix<double,_1,_8,_1,_1,_8> p1;
  Matrix<double,_10,_10,_0,_10,_10> A3;
  Matrix<double,_1,_8,_1,_1,_8> p2;
  Matrix<double,_1,_4,_1,_1,_4> b32_part2;
  Matrix<double,_1,_4,_1,_1,_4> b22_part2;
  Matrix<double,_1,_4,_1,_1,_4> b12_part2;
  Matrix<double,_1,_4,_1,_1,_4> b31_part2;
  Matrix<double,_1,_4,_1,_1,_4> b21_part2;
  Matrix<double,_1,_4,_1,_1,_4> b11_part2;
  Matrix<double,_1,_5,_1,_1,_5> b33_part2;
  Matrix<double,_1,_5,_1,_1,_5> b33_part1;
  Matrix<double,_1,_5,_1,_1,_5> b23_part2;
  Matrix<double,_1,_5,_1,_1,_5> b13_part2;
  Matrix<double,_1,_7,_1,_1,_7> p3_part2;
  Matrix<double,_1,_7,_1,_1,_7> p3_part1;
  Matrix<double,_1,_8,_1,_1,_8> p2_part2;
  Matrix<double,_1,_8,_1,_1,_8> p2_part1;
  Matrix<double,_1,_8,_1,_1,_8> p1_part2;
  Matrix<double,_1,_8,_1,_1,_8> p1_part1;
  Matrix<double,_1,_11,_1,_1,_11> p_order10;
  Matrix<double,_1,_11,_1,_1,_11> p_order10_part3;
  Matrix<double,_1,_11,_1,_1,_11> p_order10_part2;
  Matrix<double,_10,_20,_0,_10,_20> A;
  Matrix<double,_10,_10,_0,_10,_10> A2;
  Matrix<double,_10,_10,_0,_10,_10> A1;
  FullPivLU<Eigen::Matrix<double,_10,_10,_0,_10,_10>_> luA1;
  Matrix<double,__1,__1,_0,__1,__1> local_2128;
  _Vector_base<double,_std::allocator<double>_> local_2110;
  undefined1 local_20f8 [16];
  Matrix<double,__1,__1,_0,__1,__1> *local_20e8;
  variable_if_dynamic<long,__1> local_20e0;
  variable_if_dynamic<long,__1> local_20d8;
  PointerType local_20d0;
  PointerType local_20c8;
  Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false> local_20c0;
  Matrix<double,__1,__1,_0,__1,__1> local_2090;
  void *local_2078;
  long local_2070;
  PlainObjectBase<Eigen::Matrix<double,10,10,0,10,10>> *local_2068;
  essentials_t *local_2060;
  double *local_2058;
  double *local_2050;
  double *local_2048;
  Matrix<double,_1,_11,_1,_1,_11> local_2040;
  Sturm local_1fe8;
  DenseStorage<double,_4,_1,_4,_1> local_1fc0;
  DenseStorage<double,_4,_1,_4,_1> local_1fa0;
  undefined1 local_1f80 [8];
  double local_1f78;
  PlainObjectBase<Eigen::Matrix<double,10,10,0,10,10>> *local_1f70;
  variable_if_dynamic<long,__1> local_1f68;
  variable_if_dynamic<long,__1> local_1f60;
  scalar_constant_op<double> sStack_1f58;
  Matrix<double,_9,_4,_0,_9,_4> *local_1f50;
  Matrix<double,_9,_4,_0,_9,_4> *local_1f40;
  undefined1 local_1f38 [16];
  Index local_1f28;
  scalar_constant_op<double> local_1f08;
  double *local_1f00;
  Matrix<double,_9,_4,_0,_9,_4> *local_1ef0;
  variable_if_dynamic<long,__1> local_1ee8;
  variable_if_dynamic<long,__1> local_1ee0;
  Index local_1ed8;
  scalar_constant_op<double> local_1eb0;
  double *local_1ea8;
  Matrix<double,_9,_4,_0,_9,_4> *local_1e98;
  variable_if_dynamic<long,__1> local_1e90;
  variable_if_dynamic<long,__1> local_1e88;
  Index local_1e80;
  double *local_1e68;
  Matrix<double,_9,_4,_0,_9,_4> *local_1e58;
  variable_if_dynamic<long,__1> local_1e50;
  variable_if_dynamic<long,__1> local_1e48;
  Index local_1e40;
  undefined8 local_1c60;
  undefined8 uStack_1c58;
  undefined8 uStack_1c50;
  undefined8 uStack_1c48;
  undefined8 local_1c40;
  undefined8 local_1c38;
  undefined8 uStack_1c30;
  undefined8 uStack_1c28;
  undefined8 uStack_1c20;
  undefined8 local_1c18;
  undefined8 local_1c10;
  undefined8 uStack_1c08;
  undefined8 uStack_1c00;
  undefined8 uStack_1bf8;
  undefined8 local_1bf0;
  undefined8 local_1be8;
  undefined8 uStack_1be0;
  undefined8 uStack_1bd8;
  undefined8 uStack_1bd0;
  undefined8 local_1bc8;
  undefined8 local_1bc0;
  undefined8 uStack_1bb8;
  undefined8 uStack_1bb0;
  PlainObjectBase<Eigen::Matrix<double,10,10,0,10,10>> *local_1b80;
  Matrix<double,_1,_5,_1,_1,_5> local_1b48;
  DenseStorage<double,_4,_1,_4,_1> local_1b20;
  PlainObjectBase<Eigen::Matrix<double,1,4,1,1,4>> local_1b00 [32];
  PlainObjectBase<Eigen::Matrix<double,1,4,1,1,4>> local_1ae0 [32];
  PlainObjectBase<Eigen::Matrix<double,1,4,1,1,4>> local_1ac0 [32];
  DenseStorage<double,_4,_1,_4,_1> local_1aa0;
  PlainObjectBase<Eigen::Matrix<double,1,4,1,1,4>> local_1a80 [32];
  DenseStorage<double,_4,_1,_4,_1> local_1a60;
  PlainObjectBase<Eigen::Matrix<double,1,4,1,1,4>> local_1a40 [32];
  DenseStorage<double,_4,_1,_4,_1> local_1a20;
  PlainObjectBase<Eigen::Matrix<double,1,4,1,1,4>> local_1a00 [40];
  Matrix<double,_1,_7,_1,_1,_7> local_19d8;
  Matrix<double,_1,_5,_1,_1,_5> local_19a0;
  PlainObjectBase<Eigen::Matrix<double,1,5,1,1,5>> local_1978 [8];
  double local_1970 [4];
  Matrix<double,_1,_5,_1,_1,_5> local_1950;
  PlainObjectBase<Eigen::Matrix<double,1,5,1,1,5>> local_1928 [8];
  double local_1920 [4];
  DenseStorage<double,_8,_1,_8,_1> local_1900;
  PlainObjectBase<Eigen::Matrix<double,10,10,0,10,10>> local_18a0 [32];
  PlainObjectBase<Eigen::Matrix<double,10,10,0,10,10>> local_1880 [8];
  PlainObjectBase<Eigen::Matrix<double,10,10,0,10,10>> local_1878 [8];
  PlainObjectBase<Eigen::Matrix<double,10,10,0,10,10>> local_1870 [8];
  PlainObjectBase<Eigen::Matrix<double,10,10,0,10,10>> local_1868 [8];
  PlainObjectBase<Eigen::Matrix<double,10,10,0,10,10>> local_1860 [8];
  PlainObjectBase<Eigen::Matrix<double,10,10,0,10,10>> local_1858 [200];
  PlainObjectBase<Eigen::Matrix<double,10,10,0,10,10>> local_1790 [8];
  PlainObjectBase<Eigen::Matrix<double,10,10,0,10,10>> local_1788 [8];
  PlainObjectBase<Eigen::Matrix<double,10,10,0,10,10>> local_1780 [8];
  PlainObjectBase<Eigen::Matrix<double,10,10,0,10,10>> local_1778 [8];
  PlainObjectBase<Eigen::Matrix<double,10,10,0,10,10>> local_1770 [8];
  PlainObjectBase<Eigen::Matrix<double,10,10,0,10,10>> local_1768 [200];
  PlainObjectBase<Eigen::Matrix<double,10,10,0,10,10>> local_16a0 [8];
  PlainObjectBase<Eigen::Matrix<double,10,10,0,10,10>> local_1698 [8];
  PlainObjectBase<Eigen::Matrix<double,10,10,0,10,10>> local_1690 [8];
  PlainObjectBase<Eigen::Matrix<double,10,10,0,10,10>> local_1688 [8];
  PlainObjectBase<Eigen::Matrix<double,10,10,0,10,10>> local_1680 [8];
  PlainObjectBase<Eigen::Matrix<double,10,10,0,10,10>> local_1678 [248];
  DenseStorage<double,_8,_1,_8,_1> local_1580;
  PlainObjectBase<Eigen::Matrix<double,1,4,1,1,4>> local_1520 [32];
  PlainObjectBase<Eigen::Matrix<double,1,4,1,1,4>> local_1500 [32];
  PlainObjectBase<Eigen::Matrix<double,1,4,1,1,4>> local_14e0 [32];
  PlainObjectBase<Eigen::Matrix<double,1,4,1,1,4>> local_14c0 [32];
  PlainObjectBase<Eigen::Matrix<double,1,4,1,1,4>> local_14a0 [32];
  PlainObjectBase<Eigen::Matrix<double,1,4,1,1,4>> local_1480 [48];
  PlainObjectBase<Eigen::Matrix<double,1,5,1,1,5>> local_1450 [40];
  PlainObjectBase<Eigen::Matrix<double,1,5,1,1,5>> local_1428 [8];
  double adStack_1420 [4];
  PlainObjectBase<Eigen::Matrix<double,1,5,1,1,5>> local_1400 [40];
  PlainObjectBase<Eigen::Matrix<double,1,5,1,1,5>> local_13d8 [40];
  Matrix<double,_1,_7,_1,_1,_7> local_13b0;
  Matrix<double,_1,_7,_1,_1,_7> local_1378;
  plain_array<double,_8,_1,_64> local_1340;
  plain_array<double,_8,_1,_64> local_1300;
  plain_array<double,_8,_1,_64> local_12c0;
  plain_array<double,_8,_1,_64> local_1280;
  PlainObjectBase<Eigen::Matrix<double,1,11,1,1,11>> local_1208 [88];
  Matrix<double,_1,_11,_1,_1,_11> local_11b0;
  PlainObjectBase<Eigen::Matrix<double,10,10,0,10,10>> local_1158 [88];
  PlainObjectBase<Eigen::Matrix<double,10,10,0,10,10>> local_1100 [800];
  PlainObjectBase<Eigen::Matrix<double,10,10,0,10,10>> local_de0 [800];
  PlainObjectBase<Eigen::Matrix<double,10,10,0,10,10>> local_ac0 [800];
  PlainObjectBase<Eigen::Matrix<double,10,10,0,10,10>> local_7a0 [800];
  FullPivLU<Eigen::Matrix<double,10,10,0,10,10>> local_480 [800];
  undefined8 local_160;
  undefined8 uStack_158;
  undefined8 uStack_150;
  undefined8 uStack_148;
  undefined8 local_140;
  undefined8 local_138;
  undefined8 uStack_130;
  undefined8 uStack_128;
  undefined8 uStack_120;
  undefined8 local_118;
  undefined8 local_110;
  undefined8 uStack_108;
  undefined8 uStack_100;
  undefined8 uStack_f8;
  undefined8 local_f0;
  undefined8 local_e8;
  undefined8 uStack_e0;
  undefined8 uStack_d8;
  undefined8 uStack_d0;
  undefined8 local_c8;
  undefined8 local_c0;
  undefined8 uStack_b8;
  undefined8 uStack_b0;
  
  A_00 = local_1158 + 0x58;
  local_2060 = essentials;
  fivept_nister::composeA(EE,(Matrix<double,_10,_20,_0,_10,_20> *)A_00);
  local_1f78 = 4.94065645841247e-323;
  local_1f70 = (PlainObjectBase<Eigen::Matrix<double,10,10,0,10,10>> *)0xa;
  local_1f60.m_value = 0;
  sStack_1f58.m_other = 0.0;
  local_1f50 = (Matrix<double,_9,_4,_0,_9,_4> *)0xa;
  local_1f80 = (undefined1  [8])A_00;
  local_1f68.m_value = (long)A_00;
  Eigen::PlainObjectBase<Eigen::Matrix<double,10,10,0,10,10>>::
  _set_noalias<Eigen::Block<Eigen::Matrix<double,10,20,0,10,20>,_1,_1,false>>
            (local_7a0,
             (DenseBase<Eigen::Block<Eigen::Matrix<double,_10,_20,_0,_10,_20>,__1,__1,_false>_> *)
             local_1f80);
  local_1f80 = (undefined1  [8])(local_1100 + 800);
  local_1f78 = 4.94065645841247e-323;
  local_1f70 = (PlainObjectBase<Eigen::Matrix<double,10,10,0,10,10>> *)0xa;
  local_1f60.m_value = 0;
  sStack_1f58.m_other = 4.94065645841247e-323;
  local_1f50 = (Matrix<double,_9,_4,_0,_9,_4> *)0xa;
  local_1f68.m_value = (long)A_00;
  Eigen::PlainObjectBase<Eigen::Matrix<double,10,10,0,10,10>>::
  _set_noalias<Eigen::Block<Eigen::Matrix<double,10,20,0,10,20>,_1,_1,false>>
            (local_ac0,
             (DenseBase<Eigen::Block<Eigen::Matrix<double,_10,_20,_0,_10,_20>,__1,__1,_false>_> *)
             local_1f80);
  Eigen::FullPivLU<Eigen::Matrix<double,10,10,0,10,10>>::
  FullPivLU<Eigen::Matrix<double,10,10,0,10,10>>
            (local_480,(EigenBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_> *)local_7a0);
  memcpy((DenseBase<Eigen::Product<Eigen::Inverse<Eigen::FullPivLU<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>_>,_Eigen::Matrix<double,_10,_10,_0,_10,_10>,_0>_>
          *)local_1f80,local_480,800);
  local_1c40 = local_140;
  local_1c60 = local_160;
  uStack_1c58 = uStack_158;
  uStack_1c50 = uStack_150;
  uStack_1c48 = uStack_148;
  local_1c38 = local_138;
  uStack_1c30 = uStack_130;
  uStack_1c28 = uStack_128;
  uStack_1c20 = uStack_120;
  local_1c18 = local_118;
  local_1c10 = local_110;
  uStack_1c08 = uStack_108;
  uStack_1c00 = uStack_100;
  uStack_1bf8 = uStack_f8;
  local_1bf0 = local_f0;
  local_1be8 = local_e8;
  uStack_1be0 = uStack_e0;
  uStack_1bd8 = uStack_d8;
  uStack_1bd0 = uStack_d0;
  local_1bc8 = local_c8;
  local_1bc0 = local_c0;
  uStack_1bb8 = uStack_b8;
  uStack_1bb0 = uStack_b0;
  local_1b80 = local_ac0;
  Eigen::PlainObjectBase<Eigen::Matrix<double,10,10,0,10,10>>::
  _set_noalias<Eigen::Product<Eigen::Inverse<Eigen::FullPivLU<Eigen::Matrix<double,10,10,0,10,10>>>,Eigen::Matrix<double,10,10,0,10,10>,0>>
            (local_18a0,
             (DenseBase<Eigen::Product<Eigen::Inverse<Eigen::FullPivLU<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>_>,_Eigen::Matrix<double,_10,_10,_0,_10,_10>,_0>_>
              *)local_1f80);
  local_1f78 = 0.0;
  Eigen::PlainObjectBase<Eigen::Matrix<double,1,4,1,1,4>>::
  _set_noalias<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,4,1,1,4>>>
            (local_1a00,
             (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
              *)local_1f80);
  local_1f80 = (undefined1  [8])(local_18a0 + 0x20);
  local_1f68.m_value = 4;
  local_1f60.m_value = 0;
  sStack_1f58.m_other = 4.94065645841247e-324;
  local_2040.super_PlainObjectBase<Eigen::Matrix<double,_1,_11,_1,_1,_11>_>.m_storage.m_data.array
  [0] = (double)((ulong)local_1a00 | 8);
  local_2040.super_PlainObjectBase<Eigen::Matrix<double,_1,_11,_1,_1,_11>_>.m_storage.m_data.array
  [4] = 4.94065645841247e-324;
  local_2040.super_PlainObjectBase<Eigen::Matrix<double,_1,_11,_1,_1,_11>_>.m_storage.m_data.array
  [5] = 1.97626258336499e-323;
  local_2040.super_PlainObjectBase<Eigen::Matrix<double,_1,_11,_1,_1,_11>_>.m_storage.m_data.array
  [2] = (double)local_1a00;
  local_1f70 = local_18a0;
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,1,4,1,1,4>,1,3,false>,Eigen::Block<Eigen::Matrix<double,10,10,0,10,10>,1,3,false>>
            ((Block<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_1,_3,_false> *)&local_2040,
             (Block<Eigen::Matrix<double,_10,_10,_0,_10,_10>,_1,_3,_false> *)local_1f80);
  local_1f78 = 0.0;
  Eigen::PlainObjectBase<Eigen::Matrix<double,1,4,1,1,4>>::
  _set_noalias<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,4,1,1,4>>>
            (local_1480,
             (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
              *)local_1f80);
  local_1f80 = (undefined1  [8])(local_18a0 + 0x28);
  local_1f70 = local_18a0;
  local_1f68.m_value = 5;
  local_1f60.m_value = 0;
  local_2040.super_PlainObjectBase<Eigen::Matrix<double,_1,_11,_1,_1,_11>_>.m_storage.m_data.array
  [4] = 0.0;
  sStack_1f58.m_other = 4.94065645841247e-324;
  local_2040.super_PlainObjectBase<Eigen::Matrix<double,_1,_11,_1,_1,_11>_>.m_storage.m_data.array
  [5] = 1.97626258336499e-323;
  local_2040.super_PlainObjectBase<Eigen::Matrix<double,_1,_11,_1,_1,_11>_>.m_storage.m_data.array
  [0] = (double)local_1480;
  local_2040.super_PlainObjectBase<Eigen::Matrix<double,_1,_11,_1,_1,_11>_>.m_storage.m_data.array
  [2] = (double)local_1480;
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,1,4,1,1,4>,1,3,false>,Eigen::Block<Eigen::Matrix<double,10,10,0,10,10>,1,3,false>>
            ((Block<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_1,_3,_false> *)&local_2040,
             (Block<Eigen::Matrix<double,_10,_10,_0,_10,_10>,_1,_3,_false> *)local_1f80);
  local_1f78 = 0.0;
  local_1a20.m_data.array =
       (plain_array<double,_4,_1,_32>)vsubpd_avx(local_1a00._0_32_,local_1480._0_32_);
  Eigen::PlainObjectBase<Eigen::Matrix<double,1,4,1,1,4>>::
  _set_noalias<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,4,1,1,4>>>
            (local_1a40,
             (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
              *)local_1f80);
  local_1f80 = (undefined1  [8])(local_18a0 + 0x30);
  local_1f70 = local_18a0;
  local_1f68.m_value = 6;
  local_1f60.m_value = 0;
  sStack_1f58.m_other = 4.94065645841247e-324;
  local_2040.super_PlainObjectBase<Eigen::Matrix<double,_1,_11,_1,_1,_11>_>.m_storage.m_data.array
  [0] = (double)((ulong)local_1a40 | 8);
  local_2040.super_PlainObjectBase<Eigen::Matrix<double,_1,_11,_1,_1,_11>_>.m_storage.m_data.array
  [4] = 4.94065645841247e-324;
  local_2040.super_PlainObjectBase<Eigen::Matrix<double,_1,_11,_1,_1,_11>_>.m_storage.m_data.array
  [5] = 1.97626258336499e-323;
  local_2040.super_PlainObjectBase<Eigen::Matrix<double,_1,_11,_1,_1,_11>_>.m_storage.m_data.array
  [2] = (double)local_1a40;
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,1,4,1,1,4>,1,3,false>,Eigen::Block<Eigen::Matrix<double,10,10,0,10,10>,1,3,false>>
            ((Block<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_1,_3,_false> *)&local_2040,
             (Block<Eigen::Matrix<double,_10,_10,_0,_10,_10>,_1,_3,_false> *)local_1f80);
  local_1f78 = 0.0;
  Eigen::PlainObjectBase<Eigen::Matrix<double,1,4,1,1,4>>::
  _set_noalias<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,4,1,1,4>>>
            (local_14a0,
             (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
              *)local_1f80);
  local_1f80 = (undefined1  [8])(local_18a0 + 0x38);
  local_1f70 = local_18a0;
  local_1f68.m_value = 7;
  local_1f60.m_value = 0;
  local_2040.super_PlainObjectBase<Eigen::Matrix<double,_1,_11,_1,_1,_11>_>.m_storage.m_data.array
  [4] = 0.0;
  sStack_1f58.m_other = 4.94065645841247e-324;
  local_2040.super_PlainObjectBase<Eigen::Matrix<double,_1,_11,_1,_1,_11>_>.m_storage.m_data.array
  [5] = 1.97626258336499e-323;
  local_2040.super_PlainObjectBase<Eigen::Matrix<double,_1,_11,_1,_1,_11>_>.m_storage.m_data.array
  [0] = (double)local_14a0;
  local_2040.super_PlainObjectBase<Eigen::Matrix<double,_1,_11,_1,_1,_11>_>.m_storage.m_data.array
  [2] = (double)local_14a0;
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,1,4,1,1,4>,1,3,false>,Eigen::Block<Eigen::Matrix<double,10,10,0,10,10>,1,3,false>>
            ((Block<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_1,_3,_false> *)&local_2040,
             (Block<Eigen::Matrix<double,_10,_10,_0,_10,_10>,_1,_3,_false> *)local_1f80);
  local_1f78 = 0.0;
  local_1a60.m_data.array =
       (plain_array<double,_4,_1,_32>)
       vsubpd_avx((undefined1  [32])local_1a40,(undefined1  [32])local_14a0);
  Eigen::PlainObjectBase<Eigen::Matrix<double,1,4,1,1,4>>::
  _set_noalias<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,4,1,1,4>>>
            (local_1a80,
             (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
              *)local_1f80);
  local_1f80 = (undefined1  [8])(local_18a0 + 0x40);
  local_1f70 = local_18a0;
  local_1f68.m_value = 8;
  local_1f60.m_value = 0;
  local_2040.super_PlainObjectBase<Eigen::Matrix<double,_1,_11,_1,_1,_11>_>.m_storage.m_data.array
  [0] = (double)((ulong)local_1a80 | 8);
  sStack_1f58.m_other = 4.94065645841247e-324;
  local_2040.super_PlainObjectBase<Eigen::Matrix<double,_1,_11,_1,_1,_11>_>.m_storage.m_data.array
  [4] = 4.94065645841247e-324;
  local_2040.super_PlainObjectBase<Eigen::Matrix<double,_1,_11,_1,_1,_11>_>.m_storage.m_data.array
  [5] = 1.97626258336499e-323;
  local_2040.super_PlainObjectBase<Eigen::Matrix<double,_1,_11,_1,_1,_11>_>.m_storage.m_data.array
  [2] = (double)local_1a80;
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,1,4,1,1,4>,1,3,false>,Eigen::Block<Eigen::Matrix<double,10,10,0,10,10>,1,3,false>>
            ((Block<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_1,_3,_false> *)&local_2040,
             (Block<Eigen::Matrix<double,_10,_10,_0,_10,_10>,_1,_3,_false> *)local_1f80);
  local_1f78 = 0.0;
  Eigen::PlainObjectBase<Eigen::Matrix<double,1,4,1,1,4>>::
  _set_noalias<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,4,1,1,4>>>
            (local_14c0,
             (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
              *)local_1f80);
  local_1f80 = (undefined1  [8])(local_18a0 + 0x48);
  local_1f70 = local_18a0;
  local_1f68.m_value = 9;
  local_1f60.m_value = 0;
  local_2040.super_PlainObjectBase<Eigen::Matrix<double,_1,_11,_1,_1,_11>_>.m_storage.m_data.array
  [4] = 0.0;
  sStack_1f58.m_other = 4.94065645841247e-324;
  local_2040.super_PlainObjectBase<Eigen::Matrix<double,_1,_11,_1,_1,_11>_>.m_storage.m_data.array
  [5] = 1.97626258336499e-323;
  local_2040.super_PlainObjectBase<Eigen::Matrix<double,_1,_11,_1,_1,_11>_>.m_storage.m_data.array
  [0] = (double)local_14c0;
  local_2040.super_PlainObjectBase<Eigen::Matrix<double,_1,_11,_1,_1,_11>_>.m_storage.m_data.array
  [2] = (double)local_14c0;
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,1,4,1,1,4>,1,3,false>,Eigen::Block<Eigen::Matrix<double,10,10,0,10,10>,1,3,false>>
            ((Block<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_1,_3,_false> *)&local_2040,
             (Block<Eigen::Matrix<double,_10,_10,_0,_10,_10>,_1,_3,_false> *)local_1f80);
  local_1f78 = 0.0;
  local_1aa0.m_data.array =
       (plain_array<double,_4,_1,_32>)
       vsubpd_avx((undefined1  [32])local_1a80,(undefined1  [32])local_14c0);
  Eigen::PlainObjectBase<Eigen::Matrix<double,1,4,1,1,4>>::
  _set_noalias<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,4,1,1,4>>>
            (local_1ac0,
             (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
              *)local_1f80);
  local_1f80 = (undefined1  [8])(local_18a0 + 0x110);
  local_1f68.m_value = 4;
  local_1f60.m_value = 3;
  sStack_1f58.m_other = 4.94065645841247e-324;
  local_2040.super_PlainObjectBase<Eigen::Matrix<double,_1,_11,_1,_1,_11>_>.m_storage.m_data.array
  [0] = (double)((ulong)local_1ac0 | 8);
  local_2040.super_PlainObjectBase<Eigen::Matrix<double,_1,_11,_1,_1,_11>_>.m_storage.m_data.array
  [4] = 4.94065645841247e-324;
  local_2040.super_PlainObjectBase<Eigen::Matrix<double,_1,_11,_1,_1,_11>_>.m_storage.m_data.array
  [5] = 1.97626258336499e-323;
  local_2040.super_PlainObjectBase<Eigen::Matrix<double,_1,_11,_1,_1,_11>_>.m_storage.m_data.array
  [2] = (double)local_1ac0;
  local_1f70 = local_18a0;
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,1,4,1,1,4>,1,3,false>,Eigen::Block<Eigen::Matrix<double,10,10,0,10,10>,1,3,false>>
            ((Block<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_1,_3,_false> *)&local_2040,
             (Block<Eigen::Matrix<double,_10,_10,_0,_10,_10>,_1,_3,_false> *)local_1f80);
  local_1f78 = 0.0;
  Eigen::PlainObjectBase<Eigen::Matrix<double,1,4,1,1,4>>::
  _set_noalias<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,4,1,1,4>>>
            (local_14e0,
             (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
              *)local_1f80);
  local_1f80 = (undefined1  [8])(local_18a0 + 0x118);
  local_1f68.m_value = 5;
  local_1f60.m_value = 3;
  local_2040.super_PlainObjectBase<Eigen::Matrix<double,_1,_11,_1,_1,_11>_>.m_storage.m_data.array
  [4] = 0.0;
  sStack_1f58.m_other = 4.94065645841247e-324;
  local_2040.super_PlainObjectBase<Eigen::Matrix<double,_1,_11,_1,_1,_11>_>.m_storage.m_data.array
  [5] = 1.97626258336499e-323;
  local_2040.super_PlainObjectBase<Eigen::Matrix<double,_1,_11,_1,_1,_11>_>.m_storage.m_data.array
  [0] = (double)local_14e0;
  local_2040.super_PlainObjectBase<Eigen::Matrix<double,_1,_11,_1,_1,_11>_>.m_storage.m_data.array
  [2] = (double)local_14e0;
  local_1f70 = local_18a0;
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,1,4,1,1,4>,1,3,false>,Eigen::Block<Eigen::Matrix<double,10,10,0,10,10>,1,3,false>>
            ((Block<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_1,_3,_false> *)&local_2040,
             (Block<Eigen::Matrix<double,_10,_10,_0,_10,_10>,_1,_3,_false> *)local_1f80);
  local_1f78 = 0.0;
  local_1fa0.m_data.array =
       (plain_array<double,_4,_1,_32>)
       vsubpd_avx((undefined1  [32])local_1ac0,(undefined1  [32])local_14e0);
  Eigen::PlainObjectBase<Eigen::Matrix<double,1,4,1,1,4>>::
  _set_noalias<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,4,1,1,4>>>
            (local_1ae0,
             (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
              *)local_1f80);
  local_1f80 = (undefined1  [8])(local_18a0 + 0x120);
  local_1f70 = local_18a0;
  local_1f68.m_value = 6;
  local_1f60.m_value = 3;
  sStack_1f58.m_other = 4.94065645841247e-324;
  local_2040.super_PlainObjectBase<Eigen::Matrix<double,_1,_11,_1,_1,_11>_>.m_storage.m_data.array
  [0] = (double)((ulong)local_1ae0 | 8);
  local_2040.super_PlainObjectBase<Eigen::Matrix<double,_1,_11,_1,_1,_11>_>.m_storage.m_data.array
  [4] = 4.94065645841247e-324;
  local_2040.super_PlainObjectBase<Eigen::Matrix<double,_1,_11,_1,_1,_11>_>.m_storage.m_data.array
  [5] = 1.97626258336499e-323;
  local_2040.super_PlainObjectBase<Eigen::Matrix<double,_1,_11,_1,_1,_11>_>.m_storage.m_data.array
  [2] = (double)local_1ae0;
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,1,4,1,1,4>,1,3,false>,Eigen::Block<Eigen::Matrix<double,10,10,0,10,10>,1,3,false>>
            ((Block<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_1,_3,_false> *)&local_2040,
             (Block<Eigen::Matrix<double,_10,_10,_0,_10,_10>,_1,_3,_false> *)local_1f80);
  local_1f78 = 0.0;
  Eigen::PlainObjectBase<Eigen::Matrix<double,1,4,1,1,4>>::
  _set_noalias<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,4,1,1,4>>>
            (local_1500,
             (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
              *)local_1f80);
  local_1f80 = (undefined1  [8])(local_18a0 + 0x128);
  local_1f70 = local_18a0;
  local_1f68.m_value = 7;
  local_1f60.m_value = 3;
  local_2040.super_PlainObjectBase<Eigen::Matrix<double,_1,_11,_1,_1,_11>_>.m_storage.m_data.array
  [4] = 0.0;
  sStack_1f58.m_other = 4.94065645841247e-324;
  local_2040.super_PlainObjectBase<Eigen::Matrix<double,_1,_11,_1,_1,_11>_>.m_storage.m_data.array
  [5] = 1.97626258336499e-323;
  local_2040.super_PlainObjectBase<Eigen::Matrix<double,_1,_11,_1,_1,_11>_>.m_storage.m_data.array
  [0] = (double)local_1500;
  local_2040.super_PlainObjectBase<Eigen::Matrix<double,_1,_11,_1,_1,_11>_>.m_storage.m_data.array
  [2] = (double)local_1500;
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,1,4,1,1,4>,1,3,false>,Eigen::Block<Eigen::Matrix<double,10,10,0,10,10>,1,3,false>>
            ((Block<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_1,_3,_false> *)&local_2040,
             (Block<Eigen::Matrix<double,_10,_10,_0,_10,_10>,_1,_3,_false> *)local_1f80);
  local_1f78 = 0.0;
  local_1fc0.m_data.array =
       (plain_array<double,_4,_1,_32>)
       vsubpd_avx((undefined1  [32])local_1ae0,(undefined1  [32])local_1500);
  Eigen::PlainObjectBase<Eigen::Matrix<double,1,4,1,1,4>>::
  _set_noalias<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,4,1,1,4>>>
            (local_1b00,
             (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
              *)local_1f80);
  local_1f80 = (undefined1  [8])(local_18a0 + 0x130);
  local_1f70 = local_18a0;
  local_1f68.m_value = 8;
  local_1f60.m_value = 3;
  local_2040.super_PlainObjectBase<Eigen::Matrix<double,_1,_11,_1,_1,_11>_>.m_storage.m_data.array
  [0] = (double)((ulong)local_1b00 | 8);
  sStack_1f58.m_other = 4.94065645841247e-324;
  local_2040.super_PlainObjectBase<Eigen::Matrix<double,_1,_11,_1,_1,_11>_>.m_storage.m_data.array
  [4] = 4.94065645841247e-324;
  local_2040.super_PlainObjectBase<Eigen::Matrix<double,_1,_11,_1,_1,_11>_>.m_storage.m_data.array
  [5] = 1.97626258336499e-323;
  local_2040.super_PlainObjectBase<Eigen::Matrix<double,_1,_11,_1,_1,_11>_>.m_storage.m_data.array
  [2] = (double)local_1b00;
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,1,4,1,1,4>,1,3,false>,Eigen::Block<Eigen::Matrix<double,10,10,0,10,10>,1,3,false>>
            ((Block<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_1,_3,_false> *)&local_2040,
             (Block<Eigen::Matrix<double,_10,_10,_0,_10,_10>,_1,_3,_false> *)local_1f80);
  local_1f78 = 0.0;
  Eigen::PlainObjectBase<Eigen::Matrix<double,1,4,1,1,4>>::
  _set_noalias<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,4,1,1,4>>>
            (local_1520,
             (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
              *)local_1f80);
  local_1f80 = (undefined1  [8])(local_18a0 + 0x138);
  local_1f70 = local_18a0;
  local_1f68.m_value = 9;
  local_1f60.m_value = 3;
  local_2040.super_PlainObjectBase<Eigen::Matrix<double,_1,_11,_1,_1,_11>_>.m_storage.m_data.array
  [4] = 0.0;
  sStack_1f58.m_other = 4.94065645841247e-324;
  local_2040.super_PlainObjectBase<Eigen::Matrix<double,_1,_11,_1,_1,_11>_>.m_storage.m_data.array
  [5] = 1.97626258336499e-323;
  local_2040.super_PlainObjectBase<Eigen::Matrix<double,_1,_11,_1,_1,_11>_>.m_storage.m_data.array
  [0] = (double)local_1520;
  local_2040.super_PlainObjectBase<Eigen::Matrix<double,_1,_11,_1,_1,_11>_>.m_storage.m_data.array
  [2] = (double)local_1520;
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,1,4,1,1,4>,1,3,false>,Eigen::Block<Eigen::Matrix<double,10,10,0,10,10>,1,3,false>>
            ((Block<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_1,_3,_false> *)&local_2040,
             (Block<Eigen::Matrix<double,_10,_10,_0,_10,_10>,_1,_3,_false> *)local_1f80);
  local_1f78 = 0.0;
  local_1b20.m_data.array =
       (plain_array<double,_4,_1,_32>)
       vsubpd_avx((undefined1  [32])local_1b00,(undefined1  [32])local_1520);
  Eigen::PlainObjectBase<Eigen::Matrix<double,1,5,1,1,5>>::
  _set_noalias<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,5,1,1,5>>>
            (local_1928,
             (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_1,_5,_1,_1,_5>_>_>
              *)local_1f80);
  local_1f80 = (undefined1  [8])(local_18a0 + 0x200);
  local_1f68.m_value = 4;
  local_1f60.m_value = 6;
  sStack_1f58.m_other = 4.94065645841247e-324;
  local_2040.super_PlainObjectBase<Eigen::Matrix<double,_1,_11,_1,_1,_11>_>.m_storage.m_data.array
  [0] = (double)local_1920;
  local_2040.super_PlainObjectBase<Eigen::Matrix<double,_1,_11,_1,_1,_11>_>.m_storage.m_data.array
  [4] = 4.94065645841247e-324;
  local_2040.super_PlainObjectBase<Eigen::Matrix<double,_1,_11,_1,_1,_11>_>.m_storage.m_data.array
  [5] = 2.47032822920623e-323;
  local_2040.super_PlainObjectBase<Eigen::Matrix<double,_1,_11,_1,_1,_11>_>.m_storage.m_data.array
  [2] = (double)local_1928;
  local_1f70 = local_18a0;
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,1,5,1,1,5>,1,4,false>,Eigen::Block<Eigen::Matrix<double,10,10,0,10,10>,1,4,false>>
            ((Block<Eigen::Matrix<double,_1,_5,_1,_1,_5>,_1,_4,_false> *)&local_2040,
             (Block<Eigen::Matrix<double,_10,_10,_0,_10,_10>,_1,_4,_false> *)local_1f80);
  local_1f78 = 0.0;
  Eigen::PlainObjectBase<Eigen::Matrix<double,1,5,1,1,5>>::
  _set_noalias<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,5,1,1,5>>>
            (local_13d8,
             (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_1,_5,_1,_1,_5>_>_>
              *)local_1f80);
  local_1f80 = (undefined1  [8])(local_18a0 + 0x208);
  local_1f68.m_value = 5;
  local_1f60.m_value = 6;
  local_2040.super_PlainObjectBase<Eigen::Matrix<double,_1,_11,_1,_1,_11>_>.m_storage.m_data.array
  [4] = 0.0;
  sStack_1f58.m_other = 4.94065645841247e-324;
  local_2040.super_PlainObjectBase<Eigen::Matrix<double,_1,_11,_1,_1,_11>_>.m_storage.m_data.array
  [5] = 2.47032822920623e-323;
  local_2040.super_PlainObjectBase<Eigen::Matrix<double,_1,_11,_1,_1,_11>_>.m_storage.m_data.array
  [0] = (double)local_13d8;
  local_2040.super_PlainObjectBase<Eigen::Matrix<double,_1,_11,_1,_1,_11>_>.m_storage.m_data.array
  [2] = (double)local_13d8;
  local_1f70 = local_18a0;
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,1,5,1,1,5>,1,4,false>,Eigen::Block<Eigen::Matrix<double,10,10,0,10,10>,1,4,false>>
            ((Block<Eigen::Matrix<double,_1,_5,_1,_1,_5>,_1,_4,_false> *)&local_2040,
             (Block<Eigen::Matrix<double,_10,_10,_0,_10,_10>,_1,_4,_false> *)local_1f80);
  local_1f80 = (undefined1  [8])local_1928;
  local_1f78 = (double)local_13d8;
  Eigen::PlainObjectBase<Eigen::Matrix<double,1,5,1,1,5>>::
  _set_noalias<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,1,5,1,1,5>const,Eigen::Matrix<double,1,5,1,1,5>const>>
            ((PlainObjectBase<Eigen::Matrix<double,1,5,1,1,5>> *)&local_1950,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_1,_5,_1,_1,_5>,_const_Eigen::Matrix<double,_1,_5,_1,_1,_5>_>_>
              *)local_1f80);
  local_1f78 = 0.0;
  Eigen::PlainObjectBase<Eigen::Matrix<double,1,5,1,1,5>>::
  _set_noalias<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,5,1,1,5>>>
            (local_1978,
             (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_1,_5,_1,_1,_5>_>_>
              *)local_1f80);
  local_1f80 = (undefined1  [8])(local_18a0 + 0x210);
  local_1f70 = local_18a0;
  local_1f68.m_value = 6;
  local_1f60.m_value = 6;
  sStack_1f58.m_other = 4.94065645841247e-324;
  local_2040.super_PlainObjectBase<Eigen::Matrix<double,_1,_11,_1,_1,_11>_>.m_storage.m_data.array
  [0] = (double)local_1970;
  local_2040.super_PlainObjectBase<Eigen::Matrix<double,_1,_11,_1,_1,_11>_>.m_storage.m_data.array
  [4] = 4.94065645841247e-324;
  local_2040.super_PlainObjectBase<Eigen::Matrix<double,_1,_11,_1,_1,_11>_>.m_storage.m_data.array
  [5] = 2.47032822920623e-323;
  local_2040.super_PlainObjectBase<Eigen::Matrix<double,_1,_11,_1,_1,_11>_>.m_storage.m_data.array
  [2] = (double)local_1978;
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,1,5,1,1,5>,1,4,false>,Eigen::Block<Eigen::Matrix<double,10,10,0,10,10>,1,4,false>>
            ((Block<Eigen::Matrix<double,_1,_5,_1,_1,_5>,_1,_4,_false> *)&local_2040,
             (Block<Eigen::Matrix<double,_10,_10,_0,_10,_10>,_1,_4,_false> *)local_1f80);
  local_1f78 = 0.0;
  Eigen::PlainObjectBase<Eigen::Matrix<double,1,5,1,1,5>>::
  _set_noalias<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,5,1,1,5>>>
            (local_1400,
             (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_1,_5,_1,_1,_5>_>_>
              *)local_1f80);
  local_1f80 = (undefined1  [8])(local_18a0 + 0x218);
  local_1f70 = local_18a0;
  local_1f68.m_value = 7;
  local_1f60.m_value = 6;
  local_2040.super_PlainObjectBase<Eigen::Matrix<double,_1,_11,_1,_1,_11>_>.m_storage.m_data.array
  [4] = 0.0;
  sStack_1f58.m_other = 4.94065645841247e-324;
  local_2040.super_PlainObjectBase<Eigen::Matrix<double,_1,_11,_1,_1,_11>_>.m_storage.m_data.array
  [5] = 2.47032822920623e-323;
  local_2040.super_PlainObjectBase<Eigen::Matrix<double,_1,_11,_1,_1,_11>_>.m_storage.m_data.array
  [0] = (double)local_1400;
  local_2040.super_PlainObjectBase<Eigen::Matrix<double,_1,_11,_1,_1,_11>_>.m_storage.m_data.array
  [2] = (double)local_1400;
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,1,5,1,1,5>,1,4,false>,Eigen::Block<Eigen::Matrix<double,10,10,0,10,10>,1,4,false>>
            ((Block<Eigen::Matrix<double,_1,_5,_1,_1,_5>,_1,_4,_false> *)&local_2040,
             (Block<Eigen::Matrix<double,_10,_10,_0,_10,_10>,_1,_4,_false> *)local_1f80);
  local_1f80 = (undefined1  [8])local_1978;
  local_1f78 = (double)local_1400;
  Eigen::PlainObjectBase<Eigen::Matrix<double,1,5,1,1,5>>::
  _set_noalias<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,1,5,1,1,5>const,Eigen::Matrix<double,1,5,1,1,5>const>>
            ((PlainObjectBase<Eigen::Matrix<double,1,5,1,1,5>> *)&local_1b48,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_1,_5,_1,_1,_5>,_const_Eigen::Matrix<double,_1,_5,_1,_1,_5>_>_>
              *)local_1f80);
  local_1f78 = 0.0;
  Eigen::PlainObjectBase<Eigen::Matrix<double,1,5,1,1,5>>::
  _set_noalias<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,5,1,1,5>>>
            (local_1428,
             (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_1,_5,_1,_1,_5>_>_>
              *)local_1f80);
  local_1f80 = (undefined1  [8])(local_18a0 + 0x220);
  local_1f70 = local_18a0;
  local_1f68.m_value = 8;
  local_1f60.m_value = 6;
  local_2040.super_PlainObjectBase<Eigen::Matrix<double,_1,_11,_1,_1,_11>_>.m_storage.m_data.array
  [0] = (double)adStack_1420;
  sStack_1f58.m_other = 4.94065645841247e-324;
  local_2040.super_PlainObjectBase<Eigen::Matrix<double,_1,_11,_1,_1,_11>_>.m_storage.m_data.array
  [4] = 4.94065645841247e-324;
  local_2040.super_PlainObjectBase<Eigen::Matrix<double,_1,_11,_1,_1,_11>_>.m_storage.m_data.array
  [5] = 2.47032822920623e-323;
  local_2040.super_PlainObjectBase<Eigen::Matrix<double,_1,_11,_1,_1,_11>_>.m_storage.m_data.array
  [2] = (double)local_1428;
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,1,5,1,1,5>,1,4,false>,Eigen::Block<Eigen::Matrix<double,10,10,0,10,10>,1,4,false>>
            ((Block<Eigen::Matrix<double,_1,_5,_1,_1,_5>,_1,_4,_false> *)&local_2040,
             (Block<Eigen::Matrix<double,_10,_10,_0,_10,_10>,_1,_4,_false> *)local_1f80);
  local_1f78 = 0.0;
  Eigen::PlainObjectBase<Eigen::Matrix<double,1,5,1,1,5>>::
  _set_noalias<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,5,1,1,5>>>
            (local_1450,
             (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_1,_5,_1,_1,_5>_>_>
              *)local_1f80);
  local_1f80 = (undefined1  [8])(local_18a0 + 0x228);
  local_1f70 = local_18a0;
  local_1f68.m_value = 9;
  local_1f60.m_value = 6;
  local_2040.super_PlainObjectBase<Eigen::Matrix<double,_1,_11,_1,_1,_11>_>.m_storage.m_data.array
  [4] = 0.0;
  sStack_1f58.m_other = 4.94065645841247e-324;
  local_2040.super_PlainObjectBase<Eigen::Matrix<double,_1,_11,_1,_1,_11>_>.m_storage.m_data.array
  [5] = 2.47032822920623e-323;
  local_2040.super_PlainObjectBase<Eigen::Matrix<double,_1,_11,_1,_1,_11>_>.m_storage.m_data.array
  [0] = (double)local_1450;
  local_2040.super_PlainObjectBase<Eigen::Matrix<double,_1,_11,_1,_1,_11>_>.m_storage.m_data.array
  [2] = (double)local_1450;
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,1,5,1,1,5>,1,4,false>,Eigen::Block<Eigen::Matrix<double,10,10,0,10,10>,1,4,false>>
            ((Block<Eigen::Matrix<double,_1,_5,_1,_1,_5>,_1,_4,_false> *)&local_2040,
             (Block<Eigen::Matrix<double,_10,_10,_0,_10,_10>,_1,_4,_false> *)local_1f80);
  local_1f80 = (undefined1  [8])local_1428;
  local_1f78 = (double)local_1450;
  Eigen::PlainObjectBase<Eigen::Matrix<double,1,5,1,1,5>>::
  _set_noalias<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,1,5,1,1,5>const,Eigen::Matrix<double,1,5,1,1,5>const>>
            ((PlainObjectBase<Eigen::Matrix<double,1,5,1,1,5>> *)&local_19a0,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_1,_5,_1,_1,_5>,_const_Eigen::Matrix<double,_1,_5,_1,_1,_5>_>_>
              *)local_1f80);
  fivept_nister::computeSeventhOrderPolynomial
            (&local_1b48,(Matrix<double,_1,_4,_1,_1,_4> *)&local_1fa0,
             (Matrix<double,_1,_8,_1,_1,_8> *)&local_1280);
  fivept_nister::computeSeventhOrderPolynomial
            (&local_1950,(Matrix<double,_1,_4,_1,_1,_4> *)&local_1fc0,
             (Matrix<double,_1,_8,_1,_1,_8> *)&local_12c0);
  local_1900.m_data.array =
       (plain_array<double,_8,_1,_64>)
       vsubpd_avx512f((undefined1  [64])local_1280.array,(undefined1  [64])local_12c0.array);
  fivept_nister::computeSeventhOrderPolynomial
            (&local_1950,(Matrix<double,_1,_4,_1,_1,_4> *)&local_1a60,
             (Matrix<double,_1,_8,_1,_1,_8> *)&local_1300);
  fivept_nister::computeSeventhOrderPolynomial
            (&local_1b48,(Matrix<double,_1,_4,_1,_1,_4> *)&local_1a20,
             (Matrix<double,_1,_8,_1,_1,_8> *)&local_1340);
  local_1580.m_data.array =
       (plain_array<double,_8,_1,_64>)
       vsubpd_avx512f((undefined1  [64])local_1300.array,(undefined1  [64])local_1340.array);
  fivept_nister::computeSixthOrderPolynomial
            ((Matrix<double,_1,_4,_1,_1,_4> *)&local_1a20,
             (Matrix<double,_1,_4,_1,_1,_4> *)&local_1fc0,&local_1378);
  fivept_nister::computeSixthOrderPolynomial
            ((Matrix<double,_1,_4,_1,_1,_4> *)&local_1fa0,
             (Matrix<double,_1,_4,_1,_1,_4> *)&local_1a60,&local_13b0);
  local_1f80 = (undefined1  [8])&local_1378;
  local_1f78 = (double)&local_13b0;
  Eigen::PlainObjectBase<Eigen::Matrix<double,1,7,1,1,7>>::
  _set_noalias<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,1,7,1,1,7>const,Eigen::Matrix<double,1,7,1,1,7>const>>
            ((PlainObjectBase<Eigen::Matrix<double,1,7,1,1,7>> *)&local_19d8,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_1,_7,_1,_1,_7>,_const_Eigen::Matrix<double,_1,_7,_1,_1,_7>_>_>
              *)local_1f80);
  fivept_nister::computeTenthOrderPolynomialFrom73
            ((Matrix<double,_1,_8,_1,_1,_8> *)&local_1900,
             (Matrix<double,_1,_4,_1,_1,_4> *)&local_1aa0,&local_2040);
  fivept_nister::computeTenthOrderPolynomialFrom73
            ((Matrix<double,_1,_8,_1,_1,_8> *)&local_1580,
             (Matrix<double,_1,_4,_1,_1,_4> *)&local_1b20,
             (Matrix<double,_1,_11,_1,_1,_11> *)local_1158);
  fivept_nister::computeTenthOrderPolynomialFrom64(&local_19d8,&local_19a0,&local_11b0);
  local_1f78 = (double)&local_2040;
  local_1f70 = local_1158;
  local_1f60.m_value = (long)&local_11b0;
  Eigen::PlainObjectBase<Eigen::Matrix<double,1,11,1,1,11>>::
  _set_noalias<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Matrix<double,1,11,1,1,11>const,Eigen::Matrix<double,1,11,1,1,11>const>const,Eigen::Matrix<double,1,11,1,1,11>const>>
            (local_1208,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_1,_11,_1,_1,_11>,_const_Eigen::Matrix<double,_1,_11,_1,_1,_11>_>,_const_Eigen::Matrix<double,_1,_11,_1,_1,_11>_>_>
              *)local_1f80);
  Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
  PlainObjectBase<Eigen::Matrix<double,1,11,1,1,11>>
            ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)local_1f80,
             (DenseBase<Eigen::Matrix<double,_1,_11,_1,_1,_11>_> *)local_1208);
  math::Sturm::Sturm(&local_1fe8,(MatrixXd *)local_1f80);
  Eigen::internal::handmade_aligned_free((void *)local_1f80);
  math::Sturm::findRoots((vector<double,_std::allocator<double>_> *)&local_2110,&local_1fe8);
  local_20f8._0_4_ = 9;
  local_1f80 = (undefined1  [8])
               ((long)local_2110._M_impl.super__Vector_impl_data._M_finish -
                (long)local_2110._M_impl.super__Vector_impl_data._M_start >> 3);
  Eigen::Matrix<double,-1,-1,0,-1,-1>::Matrix<int,unsigned_long>
            ((Matrix<double,_1,_1,0,_1,_1> *)&local_2128,(int *)local_20f8,
             (unsigned_long *)local_1f80);
  local_2048 = (EE->super_PlainObjectBase<Eigen::Matrix<double,_9,_4,_0,_9,_4>_>).m_storage.m_data.
               array + 9;
  local_2050 = (EE->super_PlainObjectBase<Eigen::Matrix<double,_9,_4,_0,_9,_4>_>).m_storage.m_data.
               array + 0x12;
  local_2058 = (EE->super_PlainObjectBase<Eigen::Matrix<double,_9,_4,_0,_9,_4>_>).m_storage.m_data.
               array + 0x1b;
  pdVar10 = (PointerType)0x0;
  while( true ) {
    pdVar2 = (PointerType)
             ((long)local_2110._M_impl.super__Vector_impl_data._M_finish -
              (long)local_2110._M_impl.super__Vector_impl_data._M_start >> 3);
    if (pdVar2 <= pdVar10) break;
    local_20c0.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
    super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.
    super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_1>.
    super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_0>.m_data =
         (PointerType)local_2110._M_impl.super__Vector_impl_data._M_start[(long)pdVar10];
    Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
    PlainObjectBase<Eigen::Matrix<double,1,8,1,1,8>>
              ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)local_1f80,
               (DenseBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_> *)&local_1900);
    dVar12 = fivept_nister::polyVal
                       ((MatrixXd *)local_1f80,
                        (double)local_20c0.
                                super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>
                                .
                                super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>
                                .
                                super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_1>
                                .
                                super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_0>
                                .m_data);
    Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
    PlainObjectBase<Eigen::Matrix<double,1,7,1,1,7>>
              ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)local_20f8,
               (DenseBase<Eigen::Matrix<double,_1,_7,_1,_1,_7>_> *)&local_19d8);
    dVar13 = fivept_nister::polyVal
                       ((MatrixXd *)local_20f8,
                        (double)local_20c0.
                                super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>
                                .
                                super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>
                                .
                                super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_1>
                                .
                                super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_0>
                                .m_data);
    Eigen::internal::handmade_aligned_free((void *)local_20f8._0_8_);
    Eigen::internal::handmade_aligned_free((void *)local_1f80);
    local_2090.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data =
         (double *)(dVar12 / dVar13);
    Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
    PlainObjectBase<Eigen::Matrix<double,1,8,1,1,8>>
              ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)local_1f80,
               (DenseBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_> *)&local_1580);
    dVar12 = fivept_nister::polyVal
                       ((MatrixXd *)local_1f80,
                        (double)local_20c0.
                                super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>
                                .
                                super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>
                                .
                                super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_1>
                                .
                                super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_0>
                                .m_data);
    Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
    PlainObjectBase<Eigen::Matrix<double,1,7,1,1,7>>
              ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)local_20f8,
               (DenseBase<Eigen::Matrix<double,_1,_7,_1,_1,_7>_> *)&local_19d8);
    dVar13 = fivept_nister::polyVal
                       ((MatrixXd *)local_20f8,
                        (double)local_20c0.
                                super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>
                                .
                                super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>
                                .
                                super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_1>
                                .
                                super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_0>
                                .m_data);
    Eigen::internal::handmade_aligned_free((void *)local_20f8._0_8_);
    Eigen::internal::handmade_aligned_free((void *)local_1f80);
    local_2078 = (void *)(dVar12 / dVar13);
    fivept_nister::pollishCoefficients
              ((Matrix<double,_10,_20,_0,_10,_20> *)(local_1158 + 0x58),(double *)&local_2090,
               (double *)&local_2078,(double *)&local_20c0);
    sStack_1f58.m_other =
         (double)local_2090.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                 m_storage.m_data;
    local_1f38 = ZEXT816(0);
    local_1f28 = 9;
    local_1f08.m_other = (double)local_2078;
    local_1f00 = local_2048;
    local_1ee8.m_value = 0;
    local_1ee0.m_value = 1;
    local_1ed8 = 9;
    local_1eb0.m_other =
         (double)local_20c0.
                 super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
                 super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.
                 super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_1>.
                 super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_0>.
                 m_data;
    local_1ea8 = local_2050;
    local_1e90.m_value = 0;
    local_1e88.m_value = 2;
    local_1e80 = 9;
    local_1e68 = local_2058;
    local_20e0.m_value = (long)&local_2128;
    local_1e50.m_value = 0;
    local_1e48.m_value = 3;
    local_1e40 = 9;
    local_20f8._0_8_ =
         local_2128.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
         m_data + local_2128.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                  m_storage.m_rows * (long)pdVar10;
    local_20f8._8_8_ =
         local_2128.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
         m_rows;
    local_20d8.m_value = 0;
    local_20c8 = (PointerType)
                 local_2128.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                 m_storage.m_rows;
    local_20d0 = pdVar10;
    local_1f50 = EE;
    local_1f40 = EE;
    local_1ef0 = EE;
    local_1e98 = EE;
    local_1e58 = EE;
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,1,true>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,9,1,0,9,1>const>const,Eigen::Block<Eigen::Matrix<double,9,4,0,9,4>const,9,1,true>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,9,1,0,9,1>const>const,Eigen::Block<Eigen::Matrix<double,9,4,0,9,4>const,9,1,true>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,9,1,0,9,1>const>const,Eigen::Block<Eigen::Matrix<double,9,4,0,9,4>const,9,1,true>const>const>const,Eigen::Block<Eigen::Matrix<double,9,4,0,9,4>const,9,1,true>const>>
              ((Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true> *)local_20f8,
               (CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_9,_1,_0,_9,_1>_>,_const_Eigen::Block<const_Eigen::Matrix<double,_9,_4,_0,_9,_4>,_9,_1,_true>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_9,_1,_0,_9,_1>_>,_const_Eigen::Block<const_Eigen::Matrix<double,_9,_4,_0,_9,_4>,_9,_1,_true>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_9,_1,_0,_9,_1>_>,_const_Eigen::Block<const_Eigen::Matrix<double,_9,_4,_0,_9,_4>,_9,_1,_true>_>_>,_const_Eigen::Block<const_Eigen::Matrix<double,_9,_4,_0,_9,_4>,_9,_1,_true>_>
                *)local_1f80);
    pdVar10 = (PointerType)((long)pdVar10 + 1);
  }
  local_20f8._0_4_ = 1;
  local_1f80 = (undefined1  [8])pdVar2;
  Eigen::Matrix<double,-1,-1,0,-1,-1>::Matrix<int,unsigned_long>
            ((Matrix<double,_1,_1,0,_1,_1> *)&local_2090,(int *)local_20f8,
             (unsigned_long *)local_1f80);
  lVar3 = 0;
  for (pdVar10 = (PointerType)0x0;
      pdVar2 = (PointerType)
               ((long)local_2110._M_impl.super__Vector_impl_data._M_finish -
                (long)local_2110._M_impl.super__Vector_impl_data._M_start >> 3), pdVar10 < pdVar2;
      pdVar10 = (PointerType)((long)pdVar10 + 1)) {
    auVar14 = ZEXT864(0) << 0x40;
    local_2090.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data
    [local_2090.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows *
     (long)pdVar10] = 0.0;
    for (lVar5 = 0; dVar12 = auVar14._0_8_, lVar5 != 9; lVar5 = lVar5 + 1) {
      dVar13 = *(double *)
                ((long)local_2128.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                       m_storage.m_data +
                lVar5 * 8 +
                local_2128.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                m_storage.m_rows * lVar3);
      dVar12 = dVar13 * dVar13 + dVar12;
      auVar14 = ZEXT864((ulong)dVar12);
      local_2090.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data
      [local_2090.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows
       * (long)pdVar10] = dVar12;
    }
    if (dVar12 < 0.0) {
      dVar12 = sqrt(dVar12);
    }
    else {
      auVar1 = vsqrtsd_avx(auVar14._0_16_,auVar14._0_16_);
      dVar12 = auVar1._0_8_;
    }
    lVar3 = lVar3 + 8;
    local_2090.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data
    [local_2090.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows *
     (long)pdVar10] = dVar12;
  }
  local_20f8._0_4_ = 9;
  local_1f80 = (undefined1  [8])pdVar2;
  Eigen::Matrix<double,-1,-1,0,-1,-1>::Matrix<int,unsigned_long>
            ((Matrix<double,_1,_1,0,_1,_1> *)&local_2078,(int *)local_20f8,
             (unsigned_long *)local_1f80);
  lVar3 = 0;
  for (pMVar8 = (Matrix<double,_1,_11,_1,_1,_11> *)0x0;
      pMVar8 != (Matrix<double,_1,_11,_1,_1,_11> *)0x9;
      pMVar8 = (Matrix<double,_1,_11,_1,_1,_11> *)
               ((long)(pMVar8->super_PlainObjectBase<Eigen::Matrix<double,_1,_11,_1,_1,_11>_>).
                      m_storage.m_data.array + 1)) {
    local_1f80 = (undefined1  [8])((long)local_2078 + lVar3);
    local_1f70 = local_2068;
    sStack_1f58.m_other = 0.0;
    local_1f50 = (Matrix<double,_9,_4,_0,_9,_4> *)0x1;
    local_1f68.m_value = (long)&local_2078;
    local_1f60.m_value = (long)pMVar8;
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,1,_1,false>,Eigen::Matrix<double,_1,_1,0,_1,_1>>
              ((Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false> *)local_1f80,
               &local_2090);
    lVar3 = lVar3 + 8;
  }
  lVar3 = 0;
  for (lVar5 = 0; lVar5 != 9; lVar5 = lVar5 + 1) {
    pdVar6 = (double *)((long)local_2078 + lVar3);
    pdVar7 = (double *)
             ((long)local_2128.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                    m_storage.m_data + lVar3);
    lVar4 = (long)local_2110._M_impl.super__Vector_impl_data._M_finish -
            (long)local_2110._M_impl.super__Vector_impl_data._M_start >> 3;
    while (bVar11 = lVar4 != 0, lVar4 = lVar4 + -1, bVar11) {
      dVar12 = *pdVar6;
      pdVar6 = pdVar6 + local_2070;
      *pdVar7 = *pdVar7 / dVar12;
      pdVar7 = pdVar7 + local_2128.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                        m_storage.m_rows;
    }
    lVar3 = lVar3 + 8;
  }
  for (uVar9 = 0;
      uVar9 < (ulong)((long)local_2110._M_impl.super__Vector_impl_data._M_finish -
                      (long)local_2110._M_impl.super__Vector_impl_data._M_start >> 3);
      uVar9 = uVar9 + 1) {
    local_20f8._0_8_ =
         local_2128.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
         m_data + local_2128.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                  m_storage.m_rows * uVar9;
    local_20e0.m_value = 0;
    local_20d0 = (PointerType)
                 local_2128.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                 m_storage.m_rows;
    local_20c0.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
    super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_startRow.
    m_value = 0;
    local_20c0.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
    super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_startCol.
    m_value = 0;
    local_20c0.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
    super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_outerStride = 1
    ;
    local_20e8 = &local_2128;
    local_20d8.m_value = uVar9;
    local_20c0.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
    super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.
    super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_1>.
    super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_0>.m_data =
         (PointerType)local_1f80;
    local_20c0.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
    super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_xpr =
         (value_type *)local_1f80;
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,3,1,false>>>
              (&local_20c0,
               (Transpose<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_3,_1,_false>_> *)
               local_20f8);
    local_20f8._0_8_ =
         local_2128.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
         m_data + local_2128.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                  m_storage.m_rows * uVar9 + 3;
    local_20e0.m_value = 3;
    local_20d0 = (PointerType)
                 local_2128.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                 m_storage.m_rows;
    local_20c0.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
    super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.
    super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_1>.
    super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_0>.m_data =
         &local_1f78;
    local_20c0.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
    super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_startRow.
    m_value = 1;
    local_20c0.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
    super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_startCol.
    m_value = 0;
    local_20c0.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
    super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_outerStride = 1
    ;
    local_20e8 = &local_2128;
    local_20d8.m_value = uVar9;
    local_20c0.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
    super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_xpr =
         (value_type *)local_1f80;
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,3,1,false>>>
              (&local_20c0,
               (Transpose<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_3,_1,_false>_> *)
               local_20f8);
    local_20f8._0_8_ =
         local_2128.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
         m_data + local_2128.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                  m_storage.m_rows * uVar9 + 6;
    local_20e0.m_value = 6;
    local_20d0 = (PointerType)
                 local_2128.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                 m_storage.m_rows;
    local_20c0.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
    super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.
    super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_1>.
    super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_0>.m_data =
         (PointerType)&local_1f70;
    local_20c0.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
    super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_startRow.
    m_value = 2;
    local_20c0.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
    super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_startCol.
    m_value = 0;
    local_20c0.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
    super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_outerStride = 1
    ;
    local_20e8 = &local_2128;
    local_20d8.m_value = uVar9;
    local_20c0.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
    super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_xpr =
         (value_type *)local_1f80;
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,3,1,false>>>
              (&local_20c0,
               (Transpose<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_3,_1,_false>_> *)
               local_20f8);
    std::
    vector<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
    ::push_back(local_2060,(value_type *)local_1f80);
  }
  Eigen::internal::handmade_aligned_free(local_2078);
  Eigen::internal::handmade_aligned_free
            (local_2090.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
             m_data);
  Eigen::internal::handmade_aligned_free
            (local_2128.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
             m_data);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_2110);
  math::Sturm::~Sturm(&local_1fe8);
  return;
}

Assistant:

void
opengv::relative_pose::modules::fivept_nister_main(
    const Eigen::Matrix<double,9,4> & EE,
    essentials_t & essentials )
{
  Eigen::Matrix<double,10,20> A;
  fivept_nister::composeA(EE,A);

  Eigen::Matrix<double,10,10> A1 = A.block(0,0,10,10);
  Eigen::Matrix<double,10,10> A2 = A.block(0,10,10,10);

  Eigen::FullPivLU< Eigen::Matrix<double,10,10> > luA1(A1);
  Eigen::Matrix<double,10,10> A3 = luA1.inverse()*A2;

  Eigen::Matrix<double,1,4> b11_part1 = Eigen::Matrix<double,1,4>::Zero();
  b11_part1.block<1,3>(0,1) = A3.block<1,3>(4,0);
  Eigen::Matrix<double,1,4> b11_part2 = Eigen::Matrix<double,1,4>::Zero();
  b11_part2.block<1,3>(0,0) = A3.block<1,3>(5,0);
  Eigen::Matrix<double,1,4> b11 = b11_part1 - b11_part2;

  Eigen::Matrix<double,1,4> b21_part1 = Eigen::Matrix<double,1,4>::Zero();
  b21_part1.block<1,3>(0,1) = A3.block<1,3>(6,0);
  Eigen::Matrix<double,1,4> b21_part2 = Eigen::Matrix<double,1,4>::Zero();
  b21_part2.block<1,3>(0,0) = A3.block<1,3>(7,0);
  Eigen::Matrix<double,1,4> b21 = b21_part1 - b21_part2;

  Eigen::Matrix<double,1,4> b31_part1 = Eigen::Matrix<double,1,4>::Zero();
  b31_part1.block<1,3>(0,1) = A3.block<1,3>(8,0);
  Eigen::Matrix<double,1,4> b31_part2 = Eigen::Matrix<double,1,4>::Zero();
  b31_part2.block<1,3>(0,0) = A3.block<1,3>(9,0);
  Eigen::Matrix<double,1,4> b31 = b31_part1 - b31_part2;

  Eigen::Matrix<double,1,4> b12_part1 = Eigen::Matrix<double,1,4>::Zero();
  b12_part1.block<1,3>(0,1) = A3.block<1,3>(4,3);
  Eigen::Matrix<double,1,4> b12_part2 = Eigen::Matrix<double,1,4>::Zero();
  b12_part2.block<1,3>(0,0) = A3.block<1,3>(5,3);
  Eigen::Matrix<double,1,4> b12 = b12_part1 - b12_part2;

  Eigen::Matrix<double,1,4> b22_part1 = Eigen::Matrix<double,1,4>::Zero();
  b22_part1.block<1,3>(0,1) = A3.block<1,3>(6,3);
  Eigen::Matrix<double,1,4> b22_part2 = Eigen::Matrix<double,1,4>::Zero();
  b22_part2.block<1,3>(0,0) = A3.block<1,3>(7,3);
  Eigen::Matrix<double,1,4> b22 = b22_part1 - b22_part2;

  Eigen::Matrix<double,1,4> b32_part1 = Eigen::Matrix<double,1,4>::Zero();
  b32_part1.block<1,3>(0,1) = A3.block<1,3>(8,3);
  Eigen::Matrix<double,1,4> b32_part2 = Eigen::Matrix<double,1,4>::Zero();
  b32_part2.block<1,3>(0,0) = A3.block<1,3>(9,3);
  Eigen::Matrix<double,1,4> b32 = b32_part1 - b32_part2;

  Eigen::Matrix<double,1,5> b13_part1 = Eigen::Matrix<double,1,5>::Zero();
  b13_part1.block<1,4>(0,1) = A3.block<1,4>(4,6);
  Eigen::Matrix<double,1,5> b13_part2 = Eigen::Matrix<double,1,5>::Zero();
  b13_part2.block<1,4>(0,0) = A3.block<1,4>(5,6);
  Eigen::Matrix<double,1,5> b13 = b13_part1 - b13_part2;

  Eigen::Matrix<double,1,5> b23_part1 = Eigen::Matrix<double,1,5>::Zero();
  b23_part1.block<1,4>(0,1) = A3.block<1,4>(6,6);
  Eigen::Matrix<double,1,5> b23_part2 = Eigen::Matrix<double,1,5>::Zero();
  b23_part2.block<1,4>(0,0) = A3.block<1,4>(7,6);
  Eigen::Matrix<double,1,5> b23 = b23_part1 - b23_part2;

  Eigen::Matrix<double,1,5> b33_part1 = Eigen::Matrix<double,1,5>::Zero();
  b33_part1.block<1,4>(0,1) = A3.block<1,4>(8,6);
  Eigen::Matrix<double,1,5> b33_part2 = Eigen::Matrix<double,1,5>::Zero();
  b33_part2.block<1,4>(0,0) = A3.block<1,4>(9,6);
  Eigen::Matrix<double,1,5> b33 = b33_part1 - b33_part2;

  Eigen::Matrix<double,1,8> p1_part1;
  fivept_nister::computeSeventhOrderPolynomial(b23,b12,p1_part1);
  Eigen::Matrix<double,1,8> p1_part2;
  fivept_nister::computeSeventhOrderPolynomial(b13,b22,p1_part2);
  Eigen::Matrix<double,1,8> p1 = p1_part1 - p1_part2;
  Eigen::Matrix<double,1,8> p2_part1;
  fivept_nister::computeSeventhOrderPolynomial(b13,b21,p2_part1);
  Eigen::Matrix<double,1,8> p2_part2;
  fivept_nister::computeSeventhOrderPolynomial(b23,b11,p2_part2);
  Eigen::Matrix<double,1,8> p2 = p2_part1 - p2_part2;
  Eigen::Matrix<double,1,7> p3_part1;
  fivept_nister::computeSixthOrderPolynomial(b11,b22,p3_part1);
  Eigen::Matrix<double,1,7> p3_part2;
  fivept_nister::computeSixthOrderPolynomial(b12,b21,p3_part2);
  Eigen::Matrix<double,1,7> p3 = p3_part1 - p3_part2;

  Eigen::Matrix<double,1,11> p_order10_part1;
  fivept_nister::computeTenthOrderPolynomialFrom73(p1,b31,p_order10_part1);
  Eigen::Matrix<double,1,11> p_order10_part2;
  fivept_nister::computeTenthOrderPolynomialFrom73(p2,b32,p_order10_part2);
  Eigen::Matrix<double,1,11> p_order10_part3;
  fivept_nister::computeTenthOrderPolynomialFrom64(p3,b33,p_order10_part3);
  Eigen::Matrix<double,1,11> p_order10 =
      p_order10_part1 + p_order10_part2 + p_order10_part3;

  math::Sturm sturmSequence(p_order10);
  std::vector<double> roots = sturmSequence.findRoots();

  Eigen::MatrixXd Evec(9,roots.size());

  for( size_t i = 0; i < roots.size(); i++ )
  {
    double z = roots[i];
    double x = fivept_nister::polyVal(p1,z)/fivept_nister::polyVal(p3,z);
    double y = fivept_nister::polyVal(p2,z)/fivept_nister::polyVal(p3,z);

    //pollishing here
    fivept_nister::pollishCoefficients(A,x,y,z);

    Evec.col(i) = x*EE.col(0) + y*EE.col(1) + z*EE.col(2) + EE.col(3);
  }

  Eigen::MatrixXd norms(1,roots.size());
  for( size_t c = 0; c < roots.size(); c++ )
  {
    norms(0,c) = 0.0;

    for( int r = 0; r < 9; r++ )
      norms(0,c) += pow( Evec(r,c), 2 );

    norms(0,c) = sqrt(norms(0,c));
  }

  Eigen::MatrixXd EvecNorms(9,roots.size());
  for( size_t i = 0; i < 9; i++ )
    EvecNorms.row(i) = norms;

  for( size_t r = 0; r < 9; r++ )
  {
    for( size_t c = 0; c < roots.size(); c++ )
      Evec(r,c) = Evec(r,c) / EvecNorms(r,c);
  }

  for( size_t c = 0; c < roots.size(); c++ )
  {
    essential_t essential;

    essential.row(0) = Evec.block<3,1>(0,c).transpose();
    essential.row(1) = Evec.block<3,1>(3,c).transpose();
    essential.row(2) = Evec.block<3,1>(6,c).transpose();

    essentials.push_back(essential);
  }
}